

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Tag::ExpandSimpleTagsArray(Tag *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  SimpleTag *pSVar5;
  undefined8 uVar6;
  SimpleTag *pSVar7;
  ulong uVar8;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  
  iVar3 = this->simple_tags_size_;
  uVar4 = this->simple_tags_count_;
  bVar9 = true;
  if (iVar3 <= (int)uVar4) {
    iVar10 = 1;
    if (iVar3 != 0) {
      iVar10 = iVar3 * 2;
    }
    uVar8 = 0xffffffffffffffff;
    if (-1 < iVar10) {
      uVar8 = (long)iVar10 << 4;
    }
    pSVar7 = (SimpleTag *)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
    uVar8 = 0;
    if (pSVar7 == (SimpleTag *)0x0) {
      bVar9 = false;
    }
    else {
      pSVar5 = this->simple_tags_;
      uVar11 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar11 = uVar8;
      }
      for (; uVar11 * 0x10 != uVar8; uVar8 = uVar8 + 0x10) {
        puVar1 = (undefined8 *)((long)&pSVar5->tag_name_ + uVar8);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pSVar7->tag_name_ + uVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
      }
      if (pSVar5 != (SimpleTag *)0x0) {
        operator_delete__(pSVar5);
      }
      this->simple_tags_ = pSVar7;
      this->simple_tags_size_ = iVar10;
    }
  }
  return bVar9;
}

Assistant:

bool Tag::ExpandSimpleTagsArray() {
  if (simple_tags_size_ > simple_tags_count_)
    return true;  // nothing to do yet

  const int size = (simple_tags_size_ == 0) ? 1 : 2 * simple_tags_size_;

  SimpleTag* const simple_tags = new (std::nothrow) SimpleTag[size];  // NOLINT
  if (simple_tags == NULL)
    return false;

  for (int idx = 0; idx < simple_tags_count_; ++idx) {
    simple_tags[idx] = simple_tags_[idx];  // shallow copy
  }

  delete[] simple_tags_;

  simple_tags_ = simple_tags;
  simple_tags_size_ = size;

  return true;
}